

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O1

int Dau_DsdToGia_rec(Gia_Man_t *pGia,char *pStr,char **p,int *pMatches,int *pLits,Vec_Int_t *vCover)

{
  Gia_Obj_t *pGVar1;
  char cVar2;
  char cVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  Gia_Obj_t *pGVar13;
  long lVar14;
  char *pcVar15;
  char *pcVar16;
  int iVar17;
  ulong uVar18;
  bool bVar19;
  int Temp [3];
  Vec_Int_t vLeaves;
  int pFans [12];
  int local_278 [12];
  Vec_Int_t local_248;
  word local_238 [65];
  
  cVar2 = **p;
  if (cVar2 == '!') {
    *p = *p + 1;
  }
  pcVar16 = *p;
  cVar3 = *pcVar16;
  if ((byte)(cVar3 + 0x9fU) < 0xc) {
    uVar7 = pLits[(int)cVar3 - 0x61];
  }
  else if (cVar3 == '[') {
    if (pStr[pMatches[(long)pcVar16 - (long)pStr]] != ']') {
      __assert_fail("**p == \'[\' && *q == \']\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                    ,0x123,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
    pcVar15 = pStr + pMatches[(long)pcVar16 - (long)pStr];
    *p = pcVar16 + 1;
    iVar17 = 0;
    if (pcVar16 + 1 < pcVar15) {
      iVar11 = 0;
      do {
        iVar6 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        iVar17 = iVar11 + 1;
        Dau_DsdAddToArray(pGia,(int *)local_238,iVar11,iVar6);
        pcVar16 = *p;
        *p = pcVar16 + 1;
        iVar11 = iVar17;
      } while (pcVar16 + 1 < pcVar15);
    }
    uVar7 = Dau_DsdBalance(pGia,(int *)local_238,iVar17,0);
    if (*p != pcVar15) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                    ,0x12a,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
  }
  else {
    if (cVar3 == '<') {
      lVar14 = (long)pMatches[(long)pcVar16 - (long)pStr];
      iVar17 = 0;
      if (pStr[lVar14 + 1] == '{') {
        pcVar15 = pStr + lVar14 + 1;
        *p = pcVar15;
        if ((*pcVar15 != '{') ||
           (pcVar15 = pStr + pMatches[(long)pcVar15 - (long)pStr], *pcVar15 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x13b,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pcVar9 = pStr + lVar14 + 2;
        *p = pcVar9;
        lVar14 = 0;
        if (pcVar9 < pcVar15) {
          lVar14 = 0;
          do {
            iVar17 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
            *(int *)((long)local_238 + lVar14 * 4) = iVar17;
            pcVar9 = *p + 1;
            *p = pcVar9;
            lVar14 = lVar14 + 1;
          } while (pcVar9 < pcVar15);
        }
        iVar17 = (int)lVar14;
        if (pcVar9 != pcVar15) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x13e,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        pLits = (int *)local_238;
      }
      *p = pcVar16;
      if ((*pcVar16 != '<') ||
         (pcVar15 = pStr + pMatches[(long)pcVar16 - (long)pStr], *pcVar15 != '>')) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x146,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (iVar17 != 0) {
        for (; pcVar16 < pcVar15; pcVar16 = pcVar16 + 1) {
          if (((byte)(*pcVar16 + 0x9fU) < 0x1a) && (iVar17 <= *pcVar16 + -0x61)) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                          ,0x14b,
                          "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                         );
          }
        }
      }
      pcVar9 = *p;
      pcVar16 = pcVar9 + 1;
      *p = pcVar16;
      if (pcVar16 < pcVar15) {
        lVar14 = 0;
        do {
          iVar17 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          *(int *)((long)local_278 + lVar14) = iVar17;
          lVar14 = lVar14 + 4;
          pcVar9 = *p;
          pcVar16 = pcVar9 + 1;
          *p = pcVar16;
        } while (pcVar16 < pcVar15);
        bVar19 = lVar14 == 0xc;
      }
      else {
        bVar19 = false;
      }
      if (!bVar19) {
        __assert_fail("pTemp == Temp + 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x14f,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar16 != pcVar15) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x150,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar15[1] == '{') {
        *p = pcVar9 + 2;
        if ((pcVar9[2] != '{') || (pStr[pMatches[(long)(pcVar9 + 2) - (long)pStr]] != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                        ,0x154,
                        "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                       );
        }
        *p = pStr + pMatches[(long)(pcVar9 + 2) - (long)pStr];
      }
      if (pGia->pMuxes == (uint *)0x0) {
        uVar7 = Gia_ManHashMux(pGia,local_278[0],local_278[1],local_278[2]);
      }
      else {
        uVar7 = Gia_ManHashMuxReal(pGia,local_278[0],local_278[1],local_278[2]);
      }
      if ((int)uVar7 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf2,"int Abc_Lit2Var(int)");
      }
      uVar8 = uVar7 >> 1;
      if (pGia->nObjs <= (int)uVar8) {
LAB_004bdd7a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      uVar18 = *(ulong *)(pGia->pObjs + uVar8);
      uVar10 = uVar18 & 0x1fffffff;
      if (uVar10 != 0x1fffffff && -1 < (int)uVar18) {
        pGVar1 = pGia->pObjs + uVar8;
        if (pGia->pMuxes == (uint *)0x0) {
          if ((~*(uint *)(pGVar1 + -uVar10) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar1 + -uVar10)) {
            Gia_ObjSetAndLevel(pGia,pGVar1 + -uVar10);
          }
          uVar18 = (ulong)(*(uint *)&pGVar1->field_0x4 & 0x1fffffff);
          if ((~*(uint *)(pGVar1 + -uVar18) & 0x1fffffff) != 0 &&
              -1 < (int)*(uint *)(pGVar1 + -uVar18)) {
            Gia_ObjSetAndLevel(pGia,pGVar1 + -uVar18);
          }
          Gia_ObjSetAndLevel(pGia,pGVar1);
        }
        else {
          Gia_ObjSetMuxLevel(pGia,pGVar1);
        }
      }
      goto LAB_004bdbb1;
    }
    if (cVar3 != '(') {
      if (5 < (byte)(cVar3 + 0xbfU) && 9 < (byte)(cVar3 - 0x30U)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x184,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      iVar17 = Abc_TtReadHex(local_238,pcVar16);
      iVar11 = 1 << ((char)iVar17 - 2U & 0x1f);
      if (iVar17 < 3) {
        iVar11 = 1;
      }
      pcVar15 = *p;
      pcVar16 = pcVar15 + iVar11;
      *p = pcVar16;
      if ((pcVar15[iVar11] != '{') ||
         (pcVar15 = pStr + pMatches[(long)pcVar16 - (long)pStr], *pcVar15 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x173,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      pcVar16 = pcVar16 + 1;
      *p = pcVar16;
      lVar14 = 0;
      if (pcVar16 < pcVar15) {
        lVar14 = 0;
        do {
          iVar11 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
          local_278[lVar14] = iVar11;
          pcVar16 = *p + 1;
          *p = pcVar16;
          lVar14 = lVar14 + 1;
        } while (pcVar16 < pcVar15);
      }
      if ((int)lVar14 != iVar17) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x176,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      if (pcVar16 != pcVar15) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                      ,0x177,
                      "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)"
                     );
      }
      local_248.pArray = local_278;
      uVar8 = pGia->nObjs;
      uVar18 = (ulong)uVar8;
      local_248.nCap = iVar17;
      local_248.nSize = iVar17;
      uVar7 = Kit_TruthToGia(pGia,(uint *)local_238,iVar17,vCover,&local_248,1);
      iVar17 = pGia->nObjs;
      if ((int)uVar8 < iVar17) {
        lVar14 = uVar18 * 0xc;
        do {
          if ((int)uVar8 < 0) goto LAB_004bdd7a;
          pGVar4 = pGia->pObjs;
          pGVar1 = (Gia_Obj_t *)(&pGVar4->field_0x0 + lVar14);
          if (pGia->fGiaSimple == 0) {
            uVar10 = *(ulong *)pGVar1;
            if ((((int)(uint)uVar10 < 0) ||
                (uVar12 = (uint)uVar10 & 0x1fffffff, uVar12 == 0x1fffffff)) ||
               (uVar12 != ((uint)(uVar10 >> 0x20) & 0x1fffffff))) goto LAB_004bd9bf;
            if ((uVar10 & 0x1fffffff) == 0x1fffffff) {
              __assert_fail("Gia_ObjIsAnd(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x219,"void Gia_ObjSetBufLevel(Gia_Man_t *, Gia_Obj_t *)");
            }
            iVar11 = (int)(uVar10 & 0x1fffffff);
            pGVar13 = (Gia_Obj_t *)(lVar14 + (ulong)(uint)(iVar11 * 4) * -3 + (long)pGVar4);
            if ((pGVar13 < pGVar4) || (pGVar4 + iVar17 <= pGVar13)) goto LAB_004bdd5b;
            uVar12 = (int)((long)(lVar14 + (ulong)(uint)(iVar11 << 2) * -3) >> 2) * -0x55555555;
            pVVar5 = pGia->vLevels;
            Vec_IntFillExtra(pVVar5,uVar12 + 1,(int)pGVar13);
            if (((int)uVar12 < 0) || (pVVar5->nSize <= (int)uVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            pGVar13 = pGia->pObjs;
            if ((pGVar1 < pGVar13) || (pGVar13 + pGia->nObjs <= pGVar1)) goto LAB_004bdd5b;
            iVar17 = pVVar5->pArray[uVar12 & 0x7fffffff];
            uVar12 = (int)((long)pGVar4 + (lVar14 - (long)pGVar13) >> 2) * -0x55555555;
            pVVar5 = pGia->vLevels;
            Vec_IntFillExtra(pVVar5,uVar12 + 1,(int)pGVar1);
            if (((int)uVar12 < 0) || (pVVar5->nSize <= (int)uVar12)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pVVar5->pArray[uVar12 & 0x7fffffff] = iVar17;
          }
          else {
LAB_004bd9bf:
            if (iVar17 <= (int)uVar18) {
LAB_004bdd5b:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                            ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            if ((pGia->pMuxes == (uint *)0x0) || (pGia->pMuxes[uVar18] == 0)) {
              uVar12 = (uint)*(undefined8 *)pGVar1;
              bVar19 = (~uVar12 & 0x1fffffff) != 0;
              if (bVar19 && -1 < (int)uVar12) {
                if ((uVar12 & 0x1fffffff) <
                    ((uint)((ulong)*(undefined8 *)pGVar1 >> 0x20) & 0x1fffffff)) {
                  Gia_ObjSetXorLevel(pGia,pGVar1);
                }
                else if (bVar19 && -1 < (int)uVar12) {
                  Gia_ObjSetAndLevel(pGia,pGVar1);
                }
              }
            }
            else {
              Gia_ObjSetMuxLevel(pGia,pGVar1);
            }
          }
          uVar18 = uVar18 + 1;
          iVar17 = pGia->nObjs;
          lVar14 = lVar14 + 0xc;
        } while ((int)uVar18 < iVar17);
      }
      m_Non1Step = m_Non1Step + 1;
      if (-1 < (int)uVar7) goto LAB_004bdbb1;
      goto LAB_004bddb8;
    }
    if (pStr[pMatches[(long)pcVar16 - (long)pStr]] != ')') {
      __assert_fail("**p == \'(\' && *q == \')\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                    ,0x115,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
    pcVar15 = pStr + pMatches[(long)pcVar16 - (long)pStr];
    *p = pcVar16 + 1;
    iVar17 = 0;
    if (pcVar16 + 1 < pcVar15) {
      iVar11 = 0;
      do {
        iVar6 = Dau_DsdToGia_rec(pGia,pStr,p,pMatches,pLits,vCover);
        iVar17 = iVar11 + 1;
        Dau_DsdAddToArray(pGia,(int *)local_238,iVar11,iVar6);
        pcVar16 = *p;
        *p = pcVar16 + 1;
        iVar11 = iVar17;
      } while (pcVar16 + 1 < pcVar15);
    }
    uVar7 = Dau_DsdBalance(pGia,(int *)local_238,iVar17,1);
    if (*p != pcVar15) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauGia.c"
                    ,0x11c,
                    "int Dau_DsdToGia_rec(Gia_Man_t *, char *, char **, int *, int *, Vec_Int_t *)")
      ;
    }
  }
  if ((int)uVar7 < 0) {
LAB_004bddb8:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf5,"int Abc_LitNotCond(int, int)");
  }
LAB_004bdbb1:
  return uVar7 ^ cVar2 == '!';
}

Assistant:

int Dau_DsdToGia_rec( Gia_Man_t * pGia, char * pStr, char ** p, int * pMatches, int * pLits, Vec_Int_t * vCover )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p < 'a' + DAU_DSD_MAX_VAR ) // var
        return Abc_LitNotCond( pLits[**p - 'a'], fCompl );
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 1 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        int pFans[DAU_DSD_MAX_VAR], nFans = 0, Fan;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Fan = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            Dau_DsdAddToArray( pGia, pFans, nFans++, Fan );
        }
        Fan = Dau_DsdBalance( pGia, pFans, nFans, 0 );
        assert( *p == q );
        return Abc_LitNotCond( Fan, fCompl );
    }
    if ( **p == '<' ) // mux
    {
        Gia_Obj_t * pObj;
        int nVars = 0;
        int Temp[3], * pTemp = Temp, Res;
        int Fanins[DAU_DSD_MAX_VAR], * pLits2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
            assert( *p == q2 );
            pLits2 = Fanins;
        }
        else
            pLits2 = pLits;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MUX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits2, vCover );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        if ( pGia->pMuxes )
            Res = Gia_ManHashMuxReal( pGia, Temp[0], Temp[1], Temp[2] );
        else
            Res = Gia_ManHashMux( pGia, Temp[0], Temp[1], Temp[2] );
        pObj = Gia_ManObj(pGia, Abc_Lit2Var(Res));
        if ( Gia_ObjIsAnd(pObj) )
        {
            if ( pGia->pMuxes )
                Gia_ObjSetMuxLevel( pGia, pObj );
            else 
            {
                if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
                if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                    Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
                Gia_ObjSetAndLevel( pGia, pObj );
            }
        }
        return Abc_LitNotCond( Res, fCompl );
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        Vec_Int_t vLeaves;  char * q;
        word pFunc[DAU_DSD_MAX_VAR > 6 ? (1 << (DAU_DSD_MAX_VAR-6)) : 1];
        int Fanins[DAU_DSD_MAX_VAR], Res, nObjOld; 
        int i, nVars = Abc_TtReadHex( pFunc, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_DsdToGia_rec( pGia, pStr, p, pMatches, pLits, vCover );
        assert( i == nVars );
        assert( *p == q );
        vLeaves.nCap = nVars;
        vLeaves.nSize = nVars;
        vLeaves.pArray = Fanins;      
        nObjOld = Gia_ManObjNum(pGia);
        Res = Kit_TruthToGia( pGia, (unsigned *)pFunc, nVars, vCover, &vLeaves, 1 );
//        assert( nVars <= 6 );
//        Res = Dau_DsdToGiaCompose_rec( pGia, pFunc[0], Fanins, nVars );
        for ( i = nObjOld; i < Gia_ManObjNum(pGia); i++ )
            Gia_ObjSetGateLevel( pGia, Gia_ManObj(pGia, i) );
        m_Non1Step++;
        return Abc_LitNotCond( Res, fCompl );
    }
    assert( 0 );
    return 0;
}